

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O1

void Gia_ManBmcAddCone(Bmc_Mna_t *p,int iStart,int iStop)

{
  undefined1 *puVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  long lVar6;
  Vec_Int_t *pVVar7;
  ulong uVar8;
  
  p->vNodes->nSize = 0;
  p->vInputs->nSize = 0;
  p->vOutputs->nSize = 0;
  Vec_IntFillExtra(p->vId2Var,p->pFrames->nObjs,iStop);
  if (iStart < iStop) {
    uVar8 = (ulong)(uint)iStart;
    do {
      pGVar3 = p->pFrames;
      iVar2 = pGVar3->vCos->nSize;
      if (iVar2 - pGVar3->nRegs <= (int)uVar8) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if ((iStart < 0) || (iVar2 <= (int)uVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = pGVar3->vCos->pArray[uVar8];
      if (((long)iVar2 < 0) || (pGVar3->nObjs <= iVar2)) goto LAB_0056be08;
      pGVar5 = pGVar3->pObjs + iVar2;
      if (pGVar3->pObjs !=
          (Gia_Obj_t *)
          ((ulong)((uint)*(undefined8 *)pGVar5 >> 0x1d & 1) ^
          (ulong)(pGVar5 + -(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)))) {
        Gia_ManBmcAddCone_rec(p,pGVar5 + -(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff));
        pGVar4 = p->pFrames->pObjs;
        if ((pGVar5 < pGVar4) || (pGVar4 + p->pFrames->nObjs <= pGVar5)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p->vOutputs,(int)((ulong)((long)pGVar5 - (long)pGVar4) >> 2) * -0x55555555);
      }
      uVar8 = uVar8 + 1;
    } while ((int)uVar8 < iStop);
  }
  pVVar7 = p->vNodes;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      iVar2 = pVVar7->pArray[lVar6];
      if (((long)iVar2 < 0) || (p->pFrames->nObjs <= iVar2)) goto LAB_0056be08;
      pGVar5 = p->pFrames->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      puVar1 = &pGVar5[iVar2].field_0x3;
      *puVar1 = *puVar1 & 0xbf;
      lVar6 = lVar6 + 1;
      pVVar7 = p->vNodes;
    } while (lVar6 < pVVar7->nSize);
  }
  pVVar7 = p->vInputs;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      iVar2 = pVVar7->pArray[lVar6];
      if (((long)iVar2 < 0) || (p->pFrames->nObjs <= iVar2)) {
LAB_0056be08:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar5 = p->pFrames->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) {
        return;
      }
      puVar1 = &pGVar5[iVar2].field_0x3;
      *puVar1 = *puVar1 & 0xbf;
      lVar6 = lVar6 + 1;
      pVVar7 = p->vInputs;
    } while (lVar6 < pVVar7->nSize);
  }
  return;
}

Assistant:

void Gia_ManBmcAddCone( Bmc_Mna_t * p, int iStart, int iStop )
{
    Gia_Obj_t * pObj;
    int i;
    Vec_IntClear( p->vNodes );
    Vec_IntClear( p->vInputs );
    Vec_IntClear( p->vOutputs );
    Vec_IntFillExtra( p->vId2Var, Gia_ManObjNum(p->pFrames), 0 );
    for ( i = iStart; i < iStop; i++ )
    {
        pObj = Gia_ManPo(p->pFrames, i);
        if ( Gia_ObjChild0(pObj) == Gia_ManConst0(p->pFrames) )
            continue;
        Gia_ManBmcAddCone_rec( p, Gia_ObjFanin0(pObj) );
        Vec_IntPush( p->vOutputs, Gia_ObjId(p->pFrames, pObj) );
    }
    // clean attributes and create new variables
    Gia_ManForEachObjVec( p->vNodes, p->pFrames, pObj, i )
        pObj->fMark0 = 0;
    Gia_ManForEachObjVec( p->vInputs, p->pFrames, pObj, i )
        pObj->fMark0 = 0;
}